

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pedestrian.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_983a7::Pedestrian::annotatePathFollowing
          (Pedestrian *this,Vec3 *future,Vec3 *onPath,Vec3 *target,float outside)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar8;
  undefined1 auVar7 [16];
  float fVar9;
  Color darkOrange;
  Color lightOrange;
  Color yellow;
  Color yellowOrange;
  Vec3 local_98;
  float local_88;
  Color local_70;
  Color local_60;
  Color local_50;
  Color local_40;
  
  local_88 = outside;
  OpenSteer::Color::Color(&local_50,1.0,1.0,0.0,1.0);
  OpenSteer::Color::Color(&local_60,1.0,0.5,0.0,1.0);
  OpenSteer::Color::Color(&local_70,0.6,0.3,0.0,1.0);
  fVar6 = 0.75;
  OpenSteer::Color::Color(&local_40,1.0,0.75,0.0,1.0);
  local_98._0_8_ = (**(code **)(*(long *)this + 0x40))(this);
  local_98.z = fVar6;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_98,future,&local_50);
  local_98._0_8_ = (**(code **)(*(long *)this + 0x40))(this);
  local_98.z = fVar6;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_98,target,&local_40);
  uVar1 = future->x;
  uVar3 = future->y;
  uVar2 = onPath->x;
  uVar4 = onPath->y;
  fVar6 = (float)uVar2 - (float)uVar1;
  fVar8 = (float)uVar4 - (float)uVar3;
  auVar7._0_8_ = CONCAT44(fVar8,fVar6);
  auVar7._8_8_ = 0;
  fVar9 = onPath->z - future->z;
  fVar6 = SQRT(fVar9 * fVar9 + fVar6 * fVar6 + fVar8 * fVar8);
  if (0.0 < fVar6) {
    auVar5._4_4_ = fVar6;
    auVar5._0_4_ = fVar6;
    auVar5._8_4_ = fVar6;
    auVar5._12_4_ = fVar6;
    auVar7 = divps(auVar7,auVar5);
  }
  local_98.z = future->z +
               (float)(~-(uint)(0.0 < fVar6) & (uint)fVar9 |
                      (uint)(fVar9 / fVar6) & -(uint)(0.0 < fVar6)) * local_88;
  local_98.y = (float)uVar3 + local_88 * (float)(auVar7._0_8_ >> 0x20);
  local_98.x = (float)uVar1 + local_88 * (float)auVar7._0_8_;
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 onPath,&local_98,&local_70);
  OpenSteer::AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_>::
  annotationLine((AnnotationMixin<OpenSteer::LocalSpaceMixin<OpenSteer::AbstractVehicle>_> *)this,
                 &local_98,future,&local_60);
  return;
}

Assistant:

void annotatePathFollowing (const Vec3& future,
                                    const Vec3& onPath,
                                    const Vec3& target,
                                    const float outside)
        {
            const Color yellow (1, 1, 0);
            const Color lightOrange (1.0f, 0.5f, 0.0f);
            const Color darkOrange  (0.6f, 0.3f, 0.0f);
            const Color yellowOrange (1.0f, 0.75f, 0.0f);

            // draw line from our position to our predicted future position
            annotationLine (position(), future, yellow);

            // draw line from our position to our steering target on the path
            annotationLine (position(), target, yellowOrange);

            // draw a two-toned line between the future test point and its
            // projection onto the path, the change from dark to light color
            // indicates the boundary of the tube.
            const Vec3 boundaryOffset = (onPath - future).normalize() * outside;
            const Vec3 onPathBoundary = future + boundaryOffset;
            annotationLine (onPath, onPathBoundary, darkOrange);
            annotationLine (onPathBoundary, future, lightOrange);
        }